

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O1

void __thiscall DynamicProfileStorage::StorageInfo::GetFilename(StorageInfo *this,char16 *filename)

{
  short sVar1;
  long lVar2;
  WCHAR local_228;
  short asStack_226 [3];
  char16 tempFile [260];
  
  local_228 = L'j';
  lVar2 = 2;
  do {
    sVar1 = *(short *)((long)L"jsdpcache_file" + lVar2);
    *(short *)((long)asStack_226 + lVar2 + -2) = sVar1;
    lVar2 = lVar2 + 2;
  } while (sVar1 != 0);
  memset(tempFile + 0xb,0xfd,0x1ea);
  _itow((this->field_1).fileId,tempFile + 10,10);
  _wmakepath_s(filename,0x104,cacheDrive,cacheDir,&local_228,L".dpd");
  return;
}

Assistant:

void DynamicProfileStorage::StorageInfo::GetFilename(_Out_writes_z_(_MAX_PATH) char16 filename[_MAX_PATH]) const
{
    char16 tempFile[_MAX_PATH];
    wcscpy_s(tempFile, _u("jsdpcache_file"));
    _itow_s(this->fileId, tempFile + _countof(_u("jsdpcache_file")) - 1, _countof(tempFile) - _countof(_u("jsdpcache_file")) + 1, 10);
    _wmakepath_s(filename, _MAX_PATH, cacheDrive, cacheDir, tempFile, _u(".dpd"));
}